

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::CLUFactor<double>::vSolveRight4update3
          (CLUFactor<double> *this,double eps,double *vec,int *idx,double *rhs,int *ridx,int rn,
          double *vec2,double eps2,double *rhs2,int *ridx2,int rn2,double *vec3,double eps3,
          double *rhs3,int *ridx3,int rn3,double *forest,int *forestNum,int *forestIdx)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  CLUFactor<double> *in_RCX;
  int *unaff_RBX;
  int *in_RSI;
  double *pdVar4;
  int *in_RDI;
  double *in_R8;
  int in_R9D;
  double *in_XMM0_Qa;
  int *in_XMM1_Qa;
  double in_XMM2_Qa;
  long in_stack_00000010;
  int *in_stack_00000018;
  int in_stack_00000020;
  int *rperm_3;
  int *in_stack_00000038;
  int k_3;
  int j_3;
  int i_3;
  double x_3;
  int *rperm_2;
  double *in_stack_00000058;
  int k_2;
  int j_2;
  int i_2;
  double x_2;
  int *rperm_1;
  int k_1;
  int j_1;
  int i_1;
  double x_1;
  int *it;
  int *rperm;
  int k;
  int j;
  int i;
  double x;
  undefined4 *eps_00;
  int *a;
  int local_c8;
  int local_c4;
  double in_stack_ffffffffffffff40;
  double *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int local_a8;
  int local_a4;
  double in_stack_ffffffffffffff60;
  double in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  CLUFactor<double> *in_stack_ffffffffffffff80;
  double *in_stack_ffffffffffffff88;
  CLUFactor<double> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  double *in_stack_ffffffffffffffa8;
  undefined8 uVar5;
  undefined4 in_stack_ffffffffffffffc0;
  
  eps_00 = &stack0x00000020;
  a = rperm_3;
  vSolveLright3(in_RCX,in_R8,(int *)CONCAT44(in_R9D,in_stack_ffffffffffffffc0),in_XMM1_Qa,in_XMM2_Qa
                ,in_stack_ffffffffffffffa8,
                (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RSI,
                (double)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),in_XMM0_Qa,
                in_RDI,unaff_RBX,(double)in_stack_ffffffffffffff90);
  if (x_3 == 0.0) {
    in_stack_ffffffffffffff68 = *(double *)(in_RDI + 0x10);
    in_stack_ffffffffffffff78 = 0;
    for (in_stack_ffffffffffffff7c = 0; in_stack_ffffffffffffff7c < in_R9D;
        in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1) {
      in_stack_ffffffffffffff74 = *(int *)((long)in_R8 + (long)in_stack_ffffffffffffff7c * 4);
      in_stack_ffffffffffffff80 =
           *(CLUFactor<double> **)(&in_RCX->stat + (long)in_stack_ffffffffffffff74 * 2);
      bVar2 = isNotZero<double,double>((double)a,(double)eps_00);
      if (bVar2) {
        enQueueMax((int *)in_R8,(int *)&stack0xffffffffffffff78,
                   *(int *)((long)in_stack_ffffffffffffff68 + (long)in_stack_ffffffffffffff74 * 4));
      }
      else {
        *(undefined8 *)(&in_RCX->stat + (long)in_stack_ffffffffffffff74 * 2) = 0;
      }
    }
  }
  else {
    in_stack_ffffffffffffff90 = *(CLUFactor<double> **)(in_RDI + 0x10);
    in_stack_ffffffffffffffa0 = 0;
    in_stack_ffffffffffffff88 = in_stack_00000058;
    for (in_stack_ffffffffffffffa4 = 0; in_stack_ffffffffffffffa4 < in_R9D;
        in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 + 1) {
      in_stack_ffffffffffffff9c = *(int *)((long)in_R8 + (long)in_stack_ffffffffffffffa4 * 4);
      uVar5 = *(undefined8 *)(&in_RCX->stat + (long)in_stack_ffffffffffffff9c * 2);
      bVar2 = isNotZero<double,double>((double)a,(double)eps_00);
      if (bVar2) {
        pdVar4 = (double *)((long)in_stack_ffffffffffffff88 + 4);
        *(int *)in_stack_ffffffffffffff88 = in_stack_ffffffffffffff9c;
        enQueueMax((int *)in_R8,(int *)&stack0xffffffffffffffa0,
                   (&in_stack_ffffffffffffff90->stat)[in_stack_ffffffffffffff9c]);
        *(undefined8 *)((long)x_3 + (long)in_stack_ffffffffffffff9c * 8) = uVar5;
      }
      else {
        *(undefined8 *)(&in_RCX->stat + (long)in_stack_ffffffffffffff9c * 2) = 0;
        pdVar4 = in_stack_ffffffffffffff88;
      }
      in_stack_ffffffffffffff88 = pdVar4;
    }
    *rperm_2 = in_stack_ffffffffffffffa0;
  }
  if ((double)in_stack_00000020 <= (double)in_RDI[1] * 0.2) {
    in_stack_ffffffffffffff48 = *(double **)(in_RDI + 0x10);
    local_a8 = 0;
    for (local_a4 = 0; local_a4 < in_stack_00000020; local_a4 = local_a4 + 1) {
      in_stack_ffffffffffffff54 = in_stack_00000018[local_a4];
      in_stack_ffffffffffffff60 =
           *(double *)(in_stack_00000010 + (long)in_stack_ffffffffffffff54 * 8);
      if (-(double)in_XMM1_Qa <= in_stack_ffffffffffffff60) {
        if (in_stack_ffffffffffffff60 <= (double)in_XMM1_Qa) {
          *(undefined8 *)(in_stack_00000010 + (long)in_stack_ffffffffffffff54 * 8) = 0;
        }
        else {
          enQueueMax(in_stack_00000018,&local_a8,
                     *(int *)((long)in_stack_ffffffffffffff48 + (long)in_stack_ffffffffffffff54 * 4)
                    );
        }
      }
      else {
        enQueueMax(in_stack_00000018,&local_a8,
                   *(int *)((long)in_stack_ffffffffffffff48 + (long)in_stack_ffffffffffffff54 * 4));
      }
    }
    in_stack_00000020 = local_a8;
  }
  else {
    *in_stack_00000018 = in_RDI[1] + -1;
  }
  if ((double)j_3 <= (double)in_RDI[1] * 0.2) {
    lVar1 = *(long *)(in_RDI + 0x10);
    local_c8 = 0;
    for (local_c4 = 0; local_c4 < j_3; local_c4 = local_c4 + 1) {
      iVar3 = in_stack_00000038[local_c4];
      in_stack_ffffffffffffff40 = *(double *)(rperm_3 + (long)iVar3 * 2);
      if (-in_XMM2_Qa <= in_stack_ffffffffffffff40) {
        if (in_stack_ffffffffffffff40 <= in_XMM2_Qa) {
          (rperm_3 + (long)iVar3 * 2)[0] = 0;
          (rperm_3 + (long)iVar3 * 2)[1] = 0;
        }
        else {
          enQueueMax(in_stack_00000038,&local_c8,*(int *)(lVar1 + (long)iVar3 * 4));
        }
      }
      else {
        enQueueMax(in_stack_00000038,&local_c8,*(int *)(lVar1 + (long)iVar3 * 4));
      }
    }
    j_3 = local_c8;
  }
  else {
    *in_stack_00000038 = in_RDI[1] + -1;
  }
  iVar3 = vSolveUright((CLUFactor<double> *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (double *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (int *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                       (int *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                       (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  vSolveUrightNoNZ(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                   (double *)in_stack_ffffffffffffff80,
                   (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  vSolveUrightNoNZ(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                   (double *)in_stack_ffffffffffffff80,
                   (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  if (in_RDI[0x28] == 0) {
    iVar3 = vSolveUpdateRight(in_stack_ffffffffffffff80,
                              (double *)
                              CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                              (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                              in_stack_ffffffffffffff60);
    vSolveUpdateRightNoNZ
              ((CLUFactor<double> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    vSolveUpdateRightNoNZ
              ((CLUFactor<double> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  }
  return iVar3;
}

Assistant:

int CLUFactor<R>::vSolveRight4update3(R eps,
                                      R* vec, int* idx,                 /* result1 */
                                      R* rhs, int* ridx, int rn,        /* rhs1    */
                                      R* vec2, R eps2,               /* result2 */
                                      R* rhs2, int* ridx2, int rn2,     /* rhs2    */
                                      R* vec3, R eps3,               /* result3 */
                                      R* rhs3, int* ridx3, int rn3,     /* rhs3    */
                                      R* forest, int* forestNum, int* forestIdx)
{

   vSolveLright3(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2, rhs3, ridx3, rn3, eps3);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);
   assert(rn3 >= 0 && rn3 <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   if(rn2 > thedim * verySparseFactor4right)
   {
      ridx2[0] = thedim - 1;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn2; ++i)
      {
         k = ridx2[i];
         assert(k >= 0 && k < thedim);
         x = rhs2[k];

         if(x < -eps2)
         {
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else if(x > eps2)
         {
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else
            rhs2[k] = 0;
      }

      rn2 = j;
   }

   if(rn3 > thedim * verySparseFactor4right)
   {
      ridx3[0] = thedim - 1;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn3; ++i)
      {
         k = ridx3[i];
         assert(k >= 0 && k < thedim);
         x = rhs3[k];

         if(x < -eps3)
         {
            enQueueMax(ridx3, &j, rperm[k]);
         }
         else if(x > eps3)
         {
            enQueueMax(ridx3, &j, rperm[k]);
         }
         else
            rhs3[k] = 0;
      }

      rn3 = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   vSolveUrightNoNZ(vec2, rhs2, ridx2, rn2, eps2);
   vSolveUrightNoNZ(vec3, rhs3, ridx3, rn3, eps3);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      vSolveUpdateRightNoNZ(vec2, eps2);
      vSolveUpdateRightNoNZ(vec3, eps3);
   }

   return rn;
}